

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O1

double ** __thiscall
Atmosphere::tabulate(Atmosphere *this,double h_start,double h_end,double h_step)

{
  double **ppdVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  double **ppdVar5;
  array<double,_3UL> local_48;
  
  uVar3 = (uint)((h_end - h_start) / h_step + 1.0);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar4 = (long)(int)uVar3 * 8;
  }
  ppdVar1 = (double **)operator_new__(uVar4);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pdVar2 = (double *)operator_new__(0x20);
      ppdVar1[uVar4] = pdVar2;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  local_48._M_elems[0] = 0.0;
  local_48._M_elems[1] = 0.0;
  local_48._M_elems[2] = 0.0;
  if (h_start <= h_end) {
    ppdVar5 = ppdVar1;
    do {
      calculate(&local_48,this,h_start);
      pdVar2 = *ppdVar5;
      *pdVar2 = h_start;
      pdVar2[1] = local_48._M_elems[0];
      pdVar2[2] = local_48._M_elems[1];
      pdVar2[3] = local_48._M_elems[2];
      h_start = h_start + h_step;
      ppdVar5 = ppdVar5 + 1;
    } while (h_start <= h_end);
  }
  return ppdVar1;
}

Assistant:

double **tabulate(double h_start, double h_end, double h_step) {

        const int size = (const int) ((h_end - h_start) / h_step + 1);
        auto **result = new double *[size];
        for (int i = 0; i < size; ++i) {
            result[i] = new double[4];
        }

        std::array<double, 3> temp{};

        int i = 0, j = 0;
        double h = h_start;
        while (h <= h_end) {
            temp = this->calculate(h);
            result[i][0] = h;
            for (j = 0; j < 3; j++) {
                result[i][j + 1] = temp[j];
            }
            h += h_step;
            i++;
        }
        return result;
    }